

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_9>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *kernel)

{
  float *pfVar1;
  type pMVar2;
  non_const_type pMVar3;
  
  pfVar1 = (kernel->m_dst->
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>).m_d.data;
  pMVar2 = (kernel->m_src->
           super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
           ).m_lhs;
  pMVar3 = (kernel->m_src->
           super_product_evaluator<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
           ).m_rhs.m_matrix;
  *pfVar1 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6] *
            (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[6] +
            (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3] *
            (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[3] +
            (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0] *
            (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  pfVar1[1] = (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[7] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[6] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[4] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[3] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[1] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[0];
  pfVar1[2] = (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[8] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[6] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[5] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[3] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[2] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[0];
  pfVar1[3] = (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[6] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[7] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[3] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[4] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[0] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[1];
  pfVar1[4] = (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[7] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[7] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[4] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[4] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[1] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[1];
  pfVar1[5] = (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[8] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[7] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[5] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[4] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[2] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[1];
  pfVar1[6] = (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[6] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[8] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[3] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[5] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[0] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[2];
  pfVar1[7] = (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[7] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[8] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[4] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[5] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[1] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[2];
  pfVar1[8] = (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[8] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[8] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[5] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[5] +
              (pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[2] *
              (pMVar3->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data
              .array[2];
  return;
}

Assistant:

void assignCoeff(Index row, Index col)
  {
    m_functor.assignCoeff(m_dst.coeffRef(row,col), m_src.coeff(row,col));
  }